

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_batch_insert.cpp
# Opt level: O2

bool __thiscall
duckdb::PhysicalBatchInsert::ExecuteTask
          (PhysicalBatchInsert *this,ClientContext *context,GlobalSinkState *gstate_p,
          LocalSinkState *lstate_p)

{
  undefined8 uVar1;
  pointer pBVar2;
  undefined8 local_30;
  
  BatchTaskManager<duckdb::BatchInsertTask>::GetTask
            ((BatchTaskManager<duckdb::BatchInsertTask> *)&stack0xffffffffffffffd0);
  uVar1 = local_30;
  if ((long *)local_30 != (long *)0x0) {
    pBVar2 = unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>
             ::operator->((unique_ptr<duckdb::BatchInsertTask,_std::default_delete<duckdb::BatchInsertTask>,_true>
                           *)&stack0xffffffffffffffd0);
    (*pBVar2->_vptr_BatchInsertTask[2])(pBVar2,this,context,gstate_p,lstate_p);
    if ((long *)local_30 != (long *)0x0) {
      (**(code **)(*(long *)local_30 + 8))();
    }
  }
  return (long *)uVar1 != (long *)0x0;
}

Assistant:

bool PhysicalBatchInsert::ExecuteTask(ClientContext &context, GlobalSinkState &gstate_p,
                                      LocalSinkState &lstate_p) const {
	auto &gstate = gstate_p.Cast<BatchInsertGlobalState>();
	auto task = gstate.task_manager.GetTask();
	if (!task) {
		return false;
	}
	task->Execute(*this, context, gstate_p, lstate_p);
	return true;
}